

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O2

void __thiscall aiLight::aiLight(aiLight *this)

{
  (this->mName).length = 0;
  (this->mName).data[0] = '\0';
  memset((this->mName).data + 1,0x1b,0x3ff);
  this->mType = aiLightSource_UNDEFINED;
  (this->mPosition).x = 0.0;
  (this->mPosition).y = 0.0;
  (this->mPosition).z = 0.0;
  (this->mDirection).x = 0.0;
  (this->mDirection).y = 0.0;
  *(undefined8 *)&(this->mDirection).z = 0;
  (this->mUp).x = 0.0;
  (this->mUp).y = 0.0;
  *(undefined8 *)&(this->mUp).z = 0;
  this->mAttenuationLinear = 1.0;
  (this->mColorAmbient).g = 0.0;
  (this->mColorAmbient).b = 0.0;
  this->mAttenuationQuadratic = 0.0;
  (this->mColorDiffuse).r = 0.0;
  (this->mColorDiffuse).g = 0.0;
  (this->mColorDiffuse).b = 0.0;
  (this->mColorSpecular).r = 0.0;
  (this->mColorSpecular).g = 0.0;
  *(undefined8 *)&(this->mColorSpecular).b = 0;
  this->mAngleInnerCone = 6.2831855;
  this->mAngleOuterCone = 6.2831855;
  (this->mSize).x = 0.0;
  (this->mSize).y = 0.0;
  return;
}

Assistant:

aiLight() AI_NO_EXCEPT
        :   mType                 (aiLightSource_UNDEFINED)
        ,   mAttenuationConstant  (0.f)
        ,   mAttenuationLinear    (1.f)
        ,   mAttenuationQuadratic (0.f)
        ,   mAngleInnerCone       ((float)AI_MATH_TWO_PI)
        ,   mAngleOuterCone       ((float)AI_MATH_TWO_PI)
        ,   mSize                 (0.f, 0.f)
    {
    }